

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O1

void u_versionFromString_63(uint8_t *versionArray,char *versionString)

{
  char *in_RAX;
  ulong uVar1;
  ulong uVar2;
  char *__nptr;
  char *end;
  char *local_28;
  
  if (versionArray == (uint8_t *)0x0) {
    return;
  }
  if (versionString != (char *)0x0) {
    local_28 = in_RAX;
    uVar1 = strtoul(versionString,&local_28,10);
    *versionArray = (uint8_t)uVar1;
    if (local_28 != versionString) {
      uVar1 = 0;
      do {
        if (uVar1 == 3) {
          uVar1 = 4;
          break;
        }
        if (*local_28 != '.') {
          uVar1 = (ulong)((int)uVar1 + 1);
          break;
        }
        __nptr = local_28 + 1;
        uVar2 = strtoul(__nptr,&local_28,10);
        versionArray[uVar1 + 1] = (uint8_t)uVar2;
        uVar1 = uVar1 + 1;
      } while (local_28 != __nptr);
      goto LAB_0017f51b;
    }
  }
  uVar1 = 0;
LAB_0017f51b:
  if (3 < (ushort)uVar1) {
    return;
  }
  memset(versionArray + (uVar1 & 0xffff),0,(ulong)(4U - (int)uVar1 & 0xffff));
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_versionFromString(UVersionInfo versionArray, const char *versionString) {
    char *end;
    uint16_t part=0;

    if(versionArray==NULL) {
        return;
    }

    if(versionString!=NULL) {
        for(;;) {
            versionArray[part]=(uint8_t)uprv_strtoul(versionString, &end, 10);
            if(end==versionString || ++part==U_MAX_VERSION_LENGTH || *end!=U_VERSION_DELIMITER) {
                break;
            }
            versionString=end+1;
        }
    }

    while(part<U_MAX_VERSION_LENGTH) {
        versionArray[part++]=0;
    }
}